

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O0

void __thiscall
so_5::stats::activity_tracking_stuff::
stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::stop
          (stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock> *this)

{
  null_lock *pnVar1;
  no_actual_lock<so_5::stats::activity_tracking_stuff::null_lock> local_11;
  stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock> *psStack_10;
  start_stop_lock_t lock;
  stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock> *this_local;
  
  psStack_10 = this;
  pnVar1 = lock_holder(this);
  no_actual_lock<so_5::stats::activity_tracking_stuff::null_lock>::no_actual_lock(&local_11,pnVar1);
  this->m_is_in_working = false;
  details::update_stats_from_current_time
            (&this->m_work_activity,(time_point)(this->m_work_started_at).__d.__r);
  return;
}

Assistant:

void
		stop()
			{
				typename LOCK_HOLDER::start_stop_lock_t lock{ lock_holder() };

				m_is_in_working = false;
				so_5::stats::details::update_stats_from_current_time(
						m_work_activity,
						m_work_started_at );
			}